

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeventdispatcher_unix.cpp
# Opt level: O0

void __thiscall
QEventDispatcherUNIX::registerTimer
          (QEventDispatcherUNIX *this,TimerId timerId,Duration interval,TimerType timerType,
          QObject *obj)

{
  long lVar1;
  long in_FS_OFFSET;
  QEventDispatcherUNIXPrivate *d;
  Duration in_stack_000000a8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  d_func((QEventDispatcherUNIX *)0x6b98e7);
  QTimerInfoList::registerTimer
            ((QTimerInfoList *)CONCAT44(timerId,timerType),obj._4_4_,in_stack_000000a8,
             (TimerType)obj,(QObject *)d);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QEventDispatcherUNIX::registerTimer(Qt::TimerId timerId, Duration interval, Qt::TimerType timerType, QObject *obj)
{
#ifndef QT_NO_DEBUG
    if (qToUnderlying(timerId) < 1 || interval.count() < 0 || !obj) {
        qWarning("QEventDispatcherUNIX::registerTimer: invalid arguments");
        return;
    } else if (obj->thread() != thread() || thread() != QThread::currentThread()) {
        qWarning("QEventDispatcherUNIX::registerTimer: timers cannot be started from another thread");
        return;
    }
#endif

    Q_D(QEventDispatcherUNIX);
    d->timerList.registerTimer(timerId, interval, timerType, obj);
}